

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

bool google::protobuf::compiler::objectivec::HasWKTWithObjCCategory(FileDescriptor *file)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  LogMessageFatal LStack_28;
  
  pcVar1 = (file->name_->_M_dataplus)._M_p;
  sVar2 = file->name_->_M_string_length;
  __y._M_str = "google/protobuf/any.proto";
  __y._M_len = 0x19;
  __x._M_str = pcVar1;
  __x._M_len = sVar2;
  bVar3 = std::operator==(__x,__y);
  if (((!bVar3) &&
      (__y_00._M_str = "google/protobuf/duration.proto", __y_00._M_len = 0x1e,
      __x_00._M_str = pcVar1, __x_00._M_len = sVar2, bVar3 = std::operator==(__x_00,__y_00), !bVar3)
      ) && (__y_01._M_str = "google/protobuf/timestamp.proto", __y_01._M_len = 0x1f,
           __x_01._M_str = pcVar1, __x_01._M_len = sVar2, bVar3 = std::operator==(__x_01,__y_01),
           !bVar3)) {
    return false;
  }
  bVar3 = IsProtobufLibraryBundledProtoFile(file);
  if (bVar3) {
    return true;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/helpers.cc"
             ,0x19d,"IsProtobufLibraryBundledProtoFile(file)");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_28);
}

Assistant:

bool HasWKTWithObjCCategory(const FileDescriptor* file) {
  // We don't check the name prefix or proto package because some files
  // (descriptor.proto), aren't shipped generated by the library, so this
  // seems to be the safest way to only catch the ones shipped.
  const absl::string_view name = file->name();
  if (name == "google/protobuf/any.proto" ||
      name == "google/protobuf/duration.proto" ||
      name == "google/protobuf/timestamp.proto") {
    ABSL_DCHECK(IsProtobufLibraryBundledProtoFile(file));
    return true;
  }
  return false;
}